

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall lest::expected::~expected(expected *this)

{
  expected *this_local;
  
  ~expected(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

expected( location where_, text expr_, text excpt_ = "" )
    : message( "failed: didn't get exception", where_, expr_, excpt_) {}